

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O0

string * google::protobuf::compiler::objectivec::EnumValueShortName_abi_cxx11_
                   (EnumValueDescriptor *descriptor)

{
  EnumValueDescriptor *in_RSI;
  string *in_RDI;
  string long_name;
  string long_name_prefix;
  string class_name;
  string *in_stack_ffffffffffffff80;
  string *in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  string local_50 [32];
  string local_30 [40];
  string *descriptor_00;
  
  descriptor_00 = in_RDI;
  EnumValueDescriptor::type(in_RSI);
  EnumName_abi_cxx11_((EnumDescriptor *)descriptor_00);
  std::operator+(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  EnumValueName_abi_cxx11_((EnumValueDescriptor *)class_name._0_8_);
  StripPrefixString(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_30);
  return in_RDI;
}

Assistant:

string EnumValueShortName(const EnumValueDescriptor* descriptor) {
  // Enum value names (EnumValueName above) are the enum name turned into
  // a class name and then the value name is CamelCased and concatenated; the
  // whole thing then gets sanitized for reserved words.
  // The "short name" is intended to be the final leaf, the value name; but
  // you can't simply send that off to sanitize as that could result in it
  // getting modified when the full name didn't.  For example enum
  // "StorageModes" has a value "retain".  So the full name is
  // "StorageModes_Retain", but if we sanitize "retain" it would become
  // "RetainValue".
  // So the right way to get the short name is to take the full enum name
  // and then strip off the enum name (leaving the value name and anything
  // done by sanitize).
  const string class_name = EnumName(descriptor->type());
  const string long_name_prefix = class_name + "_";
  const string long_name = EnumValueName(descriptor);
  return StripPrefixString(long_name, long_name_prefix);
}